

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void cpu_stl_data_ra_mips64
               (CPUArchState_conflict11 *env,target_ulong ptr,uint32_t val,uintptr_t retaddr)

{
  TCGMemOpIdx oi;
  
  oi = 0xa3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0xa0;
  }
  store_helper(env,ptr,(ulong)val,oi,retaddr,MO_BEUL);
  return;
}

Assistant:

void cpu_stl_data_ra(CPUArchState *env, target_ulong ptr,
                     uint32_t val, uintptr_t retaddr)
{
    cpu_stl_mmuidx_ra(env, ptr, val, cpu_mmu_index(env, false), retaddr);
}